

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall WrongVersionException::~WrongVersionException(WrongVersionException *this)

{
  LandstalkerException::~LandstalkerException(&this->super_LandstalkerException);
  operator_delete(this,0x28);
  return;
}

Assistant:

WrongVersionException(const std::string& message) : LandstalkerException(message)
    {}